

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidTreeNode.cpp
# Opt level: O2

SidTreeNode * __thiscall
COLLADASaxFWL::SidTreeNode::createAndAddChild(SidTreeNode *this,String *sid)

{
  SidTreeNode *this_00;
  SidTreeNode *newChild;
  SidIdentifier newIdentifier;
  SidTreeNode *local_50;
  SidIdentifier local_48;
  pair<COLLADASaxFWL::SidTreeNode::SidIdentifier,_COLLADASaxFWL::SidTreeNode_*> local_38;
  
  this_00 = (SidTreeNode *)operator_new(0x88);
  SidTreeNode(this_00,sid,this);
  local_50 = this_00;
  std::vector<COLLADASaxFWL::SidTreeNode_*,_std::allocator<COLLADASaxFWL::SidTreeNode_*>_>::
  push_back(&this->mDirectChildren,&local_50);
  if (sid->_M_string_length != 0) {
    local_48.sid = &local_50->mSid;
    local_48.hierarchyLevel = 0;
    local_38.first.hierarchyLevel = 0;
    local_38.second = local_50;
    local_38.first.sid = local_48.sid;
    std::
    _Rb_tree<COLLADASaxFWL::SidTreeNode::SidIdentifier,std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>,std::_Select1st<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>,std::less<COLLADASaxFWL::SidTreeNode::SidIdentifier>,std::allocator<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>>
    ::
    _M_emplace_unique<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier,COLLADASaxFWL::SidTreeNode*>>
              ((_Rb_tree<COLLADASaxFWL::SidTreeNode::SidIdentifier,std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>,std::_Select1st<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>,std::less<COLLADASaxFWL::SidTreeNode::SidIdentifier>,std::allocator<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>>
                *)&this->mChildren,&local_38);
    addChildToParents(this,local_50,&local_48);
  }
  return local_50;
}

Assistant:

SidTreeNode* SidTreeNode::createAndAddChild( const String& sid )
	{
		SidTreeNode* newChild = new SidTreeNode(sid, this);
		mDirectChildren.push_back(newChild);
		if ( !sid.empty() )
		{
			SidIdentifier newIdentifier(newChild->getSid(), 0);
			mChildren.insert(std::make_pair(newIdentifier, newChild));
			addChildToParents( newChild, newIdentifier );
		}
		return newChild;
	}